

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<int,_(anonymous_namespace)::Constructable_&>::streamReconstructedExpression
          (BinaryExpr<int,_(anonymous_namespace)::Constructable_&> *this,ostream *os)

{
  StringRef op;
  Constructable *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  char *pcVar1;
  size_type sVar2;
  
  Detail::stringify<int>((int *)in_RSI);
  pcVar1 = (char *)(in_RDI->field_2)._M_allocated_capacity;
  sVar2 = *(size_type *)((long)&in_RDI->field_2 + 8);
  Detail::stringify<(anonymous_namespace)::Constructable>(in_RSI);
  op.m_size = sVar2;
  op.m_start = pcVar1;
  formatReconstructedExpression
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,op,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }